

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O0

unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
create_database(vector<const_char_*,_std::allocator<const_char_*>_> *databases)

{
  size_type sVar1;
  const_reference ppcVar2;
  DatabaseInterface *pDVar3;
  char **extra_read_only_database_paths;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_RSI;
  vector<const_char_*,_std::allocator<const_char_*>_> *databases_local;
  unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
  *resolver;
  
  std::unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>::
  unique_ptr<std::default_delete<Fossilize::DatabaseInterface>,void>
            ((unique_ptr<Fossilize::DatabaseInterface,std::default_delete<Fossilize::DatabaseInterface>>
              *)databases);
  sVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(in_RSI);
  if (sVar1 == 1) {
    ppcVar2 = std::vector<const_char_*,_std::allocator<const_char_*>_>::front(in_RSI);
    pDVar3 = Fossilize::create_database(*ppcVar2,ReadOnly);
    std::
    unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>::
    reset((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           *)databases,pDVar3);
  }
  else {
    extra_read_only_database_paths =
         std::vector<const_char_*,_std::allocator<const_char_*>_>::data(in_RSI);
    sVar1 = std::vector<const_char_*,_std::allocator<const_char_*>_>::size(in_RSI);
    pDVar3 = Fossilize::create_concurrent_database
                       ((char *)0x0,ReadOnly,extra_read_only_database_paths,sVar1);
    std::
    unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>::
    reset((unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
           *)databases,pDVar3);
  }
  return (__uniq_ptr_data<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>,_true,_true>
          )(__uniq_ptr_data<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>,_true,_true>
            )databases;
}

Assistant:

static unique_ptr<DatabaseInterface> create_database(const vector<const char *> &databases)
{
	unique_ptr<DatabaseInterface> resolver;
	if (databases.size() == 1)
	{
		resolver.reset(create_database(databases.front(), DatabaseMode::ReadOnly));
	}
	else
	{
		resolver.reset(create_concurrent_database(nullptr, DatabaseMode::ReadOnly,
		                                          databases.data(), databases.size()));
	}
	return resolver;
}